

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O3

int __thiscall
gl4cts::SparseTextureClampTests::init(SparseTextureClampTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  ShaderExtensionTestCase *this_00;
  SparseTexture2LookupTestCase *pSVar1;
  string local_48;
  
  this_00 = (ShaderExtensionTestCase *)operator_new(0x98);
  context = (this->super_TestCaseGroup).m_context;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"GL_ARB_sparse_texture_clamp","");
  ShaderExtensionTestCase::ShaderExtensionTestCase(this_00,context,&local_48);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pSVar1 = (SparseTexture2LookupTestCase *)operator_new(0x278);
  SparseTexture2LookupTestCase::SparseTexture2LookupTestCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"SparseTextureClampLookupResidency",
             "Verifies if sparse texture clamp lookup functions generates access residency information"
            );
  (pSVar1->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
  super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SparseTexture2LookupTestCase_020e2780;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SparseTexture2LookupTestCase *)operator_new(0x278);
  SparseTexture2LookupTestCase::SparseTexture2LookupTestCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"SparseTextureClampLookupColor",
             "Verifies if sparse and non-sparse texture clamp lookup functions works as expected");
  (pSVar1->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
  super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SparseTexture2LookupTestCase_020e2838;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  return extraout_EAX;
}

Assistant:

void SparseTextureClampTests::init()
{
	addChild(new ShaderExtensionTestCase(m_context, "GL_ARB_sparse_texture_clamp"));
	addChild(new SparseTextureClampLookupResidencyTestCase(m_context));
	addChild(new SparseTextureClampLookupColorTestCase(m_context));
}